

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_base.hpp
# Opt level: O2

void boost::detail::function::
     functor_manager<boost::algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>_>_>
     ::manage(function_buffer *in_buffer,function_buffer *out_buffer,
             functor_manager_operation_type op)

{
  token_finderF<boost::algorithm::detail::is_any_ofF<char>_> *ptVar1;
  is_any_ofF<char> *this;
  bool bVar2;
  token_finderF<boost::algorithm::detail::is_any_ofF<char>_> *this_00;
  pointer_____offset_0x10___ *ppuStack_20;
  
  if (op == get_functor_type_tag) {
    *(pointer_____offset_0x10___ **)out_buffer =
         &algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>>::typeinfo;
    *(char *)((long)out_buffer + 8) = '\0';
    *(char *)((long)out_buffer + 9) = '\0';
    return;
  }
  switch(op) {
  case clone_functor_tag:
    ptVar1 = *(token_finderF<boost::algorithm::detail::is_any_ofF<char>_> **)in_buffer;
    this_00 = (token_finderF<boost::algorithm::detail::is_any_ofF<char>_> *)operator_new(0x20);
    algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>_>::token_finderF
              (this_00,ptVar1);
    *(token_finderF<boost::algorithm::detail::is_any_ofF<char>_> **)out_buffer = this_00;
    break;
  case move_functor_tag:
    *(undefined8 *)out_buffer = *(undefined8 *)in_buffer;
    *(undefined8 *)in_buffer = 0;
    break;
  case destroy_functor_tag:
    this = *(is_any_ofF<char> **)out_buffer;
    if (this != (is_any_ofF<char> *)0x0) {
      algorithm::detail::is_any_ofF<char>::~is_any_ofF(this);
    }
    operator_delete(this);
    goto LAB_0016e807;
  case check_functor_type_tag:
    ppuStack_20 = &algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>>::
                   typeinfo;
    bVar2 = typeindex::operator==
                      (*(type_info **)out_buffer,
                       (type_index_facade<boost::typeindex::stl_type_index,_std::type_info> *)
                       &ppuStack_20);
    if (bVar2) {
      *(undefined8 *)out_buffer = *(undefined8 *)in_buffer;
      return;
    }
LAB_0016e807:
    *(undefined8 *)out_buffer = 0;
    break;
  default:
    *(pointer_____offset_0x10___ **)out_buffer =
         &algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>>::typeinfo;
    *(char *)((long)out_buffer + 8) = '\0';
    *(char *)((long)out_buffer + 9) = '\0';
  }
  return;
}

Assistant:

static inline void
        manage(const function_buffer& in_buffer, function_buffer& out_buffer,
               functor_manager_operation_type op)
        {
          typedef typename get_function_tag<functor_type>::type tag_type;
          switch (op) {
          case get_functor_type_tag:
            out_buffer.members.type.type = &boost::typeindex::type_id<functor_type>().type_info();
            out_buffer.members.type.const_qualified = false;
            out_buffer.members.type.volatile_qualified = false;
            return;

          default:
            manager(in_buffer, out_buffer, op, tag_type());
            return;
          }
        }